

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringGetcMethod::StringGetcMethod(StringGetcMethod *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_41;
  Type *local_40;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_38;
  
  local_40 = (Type *)&builtins->intType;
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_38,__l,&local_41);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,Getc,Function,1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_38,(Type *)&builtins->byteType,true,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_38);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_006b4040;
  return;
}

Assistant:

explicit StringGetcMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Getc, SubroutineKind::Function, 1,
                               {&builtins.intType}, builtins.byteType, true) {}